

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hack.c
# Opt level: O1

void check_special_room(boolean newlev)

{
  undefined1 *puVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  level *lev;
  boolean bVar7;
  int roomno;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  mkroom *pmVar11;
  char *pcVar12;
  monst *pmVar13;
  char cVar14;
  int roomno_00;
  int iVar15;
  uint uVar16;
  long lVar17;
  char *local_68;
  
  strcpy(u.urooms0,u.urooms);
  pcVar12 = u.ushops;
  strcpy(u.ushops0,u.ushops);
  if (newlev == '\0') {
    pcVar8 = in_rooms(level,u.ux,u.uy,0);
    strcpy(u.urooms,pcVar8);
    if (u.urooms[0] == '\0') {
      local_68 = u.ushops_entered;
      pcVar8 = u.uentered;
    }
    else {
      pcVar8 = u.uentered;
      pcVar12 = u.ushops;
      local_68 = u.ushops_entered;
      pcVar10 = u.urooms;
      cVar14 = u.urooms[0];
      do {
        pcVar10 = pcVar10 + 1;
        pcVar9 = strchr(u.urooms0,(int)cVar14);
        if (pcVar9 == (char *)0x0) {
          *pcVar8 = cVar14;
          pcVar8 = pcVar8 + 1;
        }
        if ('\x11' < *(char *)((long)level->monsters + (long)pcVar10[-1] * 0xd8 + 0x335c)) {
          *pcVar12 = pcVar10[-1];
          pcVar12 = pcVar12 + 1;
          cVar14 = pcVar10[-1];
          pcVar9 = strchr(u.ushops0,(int)cVar14);
          if (pcVar9 == (char *)0x0) {
            *local_68 = cVar14;
            local_68 = local_68 + 1;
          }
        }
        cVar14 = *pcVar10;
      } while (cVar14 != '\0');
    }
    *pcVar8 = '\0';
    *pcVar12 = '\0';
    *local_68 = '\0';
    pcVar12 = u.ushops_left;
    if (u.ushops0[0] != '\0') {
      pcVar8 = u.ushops0;
      cVar14 = u.ushops0[0];
      do {
        pcVar8 = pcVar8 + 1;
        pcVar10 = strchr(u.ushops,(int)cVar14);
        if (pcVar10 == (char *)0x0) {
          *pcVar12 = cVar14;
          pcVar12 = pcVar12 + 1;
        }
        cVar14 = *pcVar8;
      } while (cVar14 != '\0');
    }
    *pcVar12 = '\0';
  }
  else {
    u.urooms[0] = '\0';
    u.uentered[0] = '\0';
    u.ushops[0] = '\0';
    u.ushops_entered[0] = '\0';
    strcpy(u.ushops_left,u.ushops0);
  }
  if (u.ushops0[0] != '\0') {
    u_left_shop(u.ushops_left,newlev);
  }
  if (u.uentered[0] != '\0' || u.ushops_entered[0] != '\0') {
    if (u.ushops_entered[0] != '\0') {
      u_entered_shop(u.ushops_entered);
    }
    if (u.uentered[0] != '\0') {
      lVar17 = 0x319716;
      cVar14 = u.uentered[0];
      do {
        roomno = (int)cVar14;
        roomno_00 = roomno + -3;
        switch(level->rooms[roomno_00].rtype) {
        case '\x02':
          pline("You enter an opulent throne room!");
          iVar15 = 2;
          bVar4 = 1;
          goto LAB_001aa98c;
        case '\x03':
          if (((u.uprops[0x1e].intrinsic != 0) ||
              (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
               (pcVar12 = "looks", ((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
             ((pcVar12 = "feels", ublindf != (obj *)0x0 &&
              (pcVar12 = "feels", ublindf->oartifact == '\x1d')))) {
            pcVar12 = "looks";
          }
          if ((((u.uprops[0x1e].intrinsic != 0) ||
               ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)))) ||
              (pcVar8 = "muddy", ((youmonst.data)->mflags1 & 0x1000) != 0)) &&
             ((pcVar8 = "humid", ublindf != (obj *)0x0 &&
              (pcVar8 = "humid", ublindf->oartifact == '\x1d')))) {
            pcVar8 = "muddy";
          }
          pline("It %s rather %s down here.",pcVar12,pcVar8);
          iVar15 = 3;
          bVar3 = 1;
          bVar4 = 0;
          goto LAB_001aa98f;
        case '\x05':
          pline("You enter a giant beehive!");
LAB_001aa94f:
          bVar2 = true;
          bVar4 = 0;
          bVar3 = 0;
          bVar6 = 0;
          bVar5 = 0;
          iVar15 = 0;
          goto LAB_001aa994;
        case '\x06':
          iVar15 = midnight();
          if (iVar15 == 0) {
            pline("You have an uncanny feeling...");
          }
          else {
            pcVar12 = locomotion(youmonst.data,"Run");
            pline("%s away!  %s away!",pcVar12,pcVar12);
          }
          iVar15 = 6;
          bVar6 = 1;
          bVar4 = 0;
          bVar3 = 0;
          goto LAB_001aa992;
        case '\a':
          bVar7 = monstinroom(mons + 0x121,roomno_00);
          if (((bVar7 == '\0') && (bVar7 = monstinroom(mons + 0x122,roomno_00), bVar7 == '\0')) &&
             ((bVar7 = monstinroom(mons + 0x123,roomno_00), bVar7 == '\0' &&
              (bVar7 = monstinroom(mons + 0x124,roomno_00), bVar7 == '\0')))) {
            pcVar12 = "You enter an abandoned barracks.";
          }
          else {
            pcVar12 = "You enter a military barracks!";
          }
          pline(pcVar12);
          iVar15 = 7;
          break;
        case '\b':
          pline("Welcome to David\'s treasure zoo!");
          bVar2 = false;
          iVar15 = 8;
          bVar5 = 1;
          bVar4 = 0;
          bVar3 = 0;
          bVar6 = 0;
          goto LAB_001aa994;
        case '\t':
          bVar7 = monstinroom(mons + 0x11e,roomno_00);
          if (bVar7 != '\0') {
            pcVar12 = Hello((monst *)0x0);
            verbalize("%s, %s, welcome to Delphi!",pcVar12,plname);
          }
          check_tutorial_message(0x16c);
          iVar15 = 9;
          break;
        case '\n':
          intemple(roomno);
        default:
          goto LAB_001aa94f;
        case '\v':
          pline("You enter a leprechaun hall!");
          iVar15 = 0xb;
          break;
        case '\f':
          pline("You enter a disgusting nest!");
          iVar15 = 0xc;
          break;
        case '\r':
          pline("You enter an anthole!");
          iVar15 = 0xd;
          break;
        case '\x0e':
          if (((u.uprops[0x1e].intrinsic == 0) &&
              (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
               (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
             ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
            pcVar12 = "You enter a beautiful garden.";
          }
          else {
            pcVar12 = "The air here smells nice and fresh!";
          }
          bVar4 = 0;
          pline(pcVar12);
          bVar3 = 0;
          bVar6 = 0;
          bVar5 = 0;
          iVar15 = 0;
          bVar2 = true;
          goto LAB_001aa994;
        case '\x0f':
          pline("You enter a dilapidated armory.");
          iVar15 = 0xf;
          break;
        case '\x10':
          pline("You enter a put of screaming lemures!");
          iVar15 = 0x10;
        }
        bVar4 = 0;
LAB_001aa98c:
        bVar3 = 0;
LAB_001aa98f:
        bVar6 = 0;
LAB_001aa992:
        bVar2 = false;
        bVar5 = 0;
LAB_001aa994:
        lev = level;
        if (!bVar2) {
          level->rooms[roomno_00].rtype = '\0';
          pmVar11 = search_special(lev,(schar)iVar15);
          if (((pmVar11 == (mkroom *)0x0) && (uVar16 = iVar15 - 2, uVar16 < 0xf)) &&
             ((0x517bU >> (uVar16 & 0x1f) & 1) != 0)) {
            puVar1 = &(level->flags).field_0x8;
            *(uint *)puVar1 = *(uint *)puVar1 & *(uint *)(&DAT_002adb38 + (ulong)uVar16 * 4);
          }
          if ((bool)(bVar6 | bVar5 | bVar4 | bVar3)) {
            for (pmVar13 = level->monlist; pmVar13 != (monst *)0x0; pmVar13 = pmVar13->nmon) {
              if (((0 < pmVar13->mhp) && ((byte)(pmVar13->mx - 1U) < 0x4f)) &&
                 ((byte)pmVar13->my < 0x15)) {
                pcVar12 = in_rooms(level,pmVar13->mx,pmVar13->my,0);
                pcVar12 = strchr(pcVar12,roomno);
                if (((pcVar12 != (char *)0x0) &&
                    ((u.uprops[0x13].extrinsic == 0 && u.uprops[0x13].intrinsic == 0 ||
                     (u.uprops[0x13].blocked != 0)))) &&
                   (uVar16 = mt_random(), uVar16 * -0x55555555 < 0x55555556)) {
                  pmVar13->field_0x62 = pmVar13->field_0x62 & 0xf7;
                }
              }
            }
          }
        }
        cVar14 = *(char *)(lVar17 + 1);
        lVar17 = lVar17 + 1;
      } while (cVar14 != '\0');
    }
  }
  return;
}

Assistant:

void check_special_room(boolean newlev)
{
	struct monst *mtmp;
	char *ptr;

	move_update(newlev);

	if (*u.ushops0)
	    u_left_shop(u.ushops_left, newlev);

	if (!*u.uentered && !*u.ushops_entered)		/* implied by newlev */
	    return;		/* no entrance messages necessary */

	/* Did we just enter a shop? */
	if (*u.ushops_entered)
	    u_entered_shop(u.ushops_entered);

	for (ptr = &u.uentered[0]; *ptr; ptr++) {
	    int roomno = *ptr - ROOMOFFSET;
	    int rt = level->rooms[roomno].rtype;

	    /* Did we just enter some other special room? */
	    /* vault.c insists that a vault remain a VAULT,
	     * and temples should remain TEMPLEs,
	     * but everything else gives a message only the first time */
	    switch (rt) {
		case ZOO:
		    pline("Welcome to David's treasure zoo!");
		    break;
		case GARDEN:
		    if (Blind) pline("The air here smells nice and fresh!");
		    else pline("You enter a beautiful garden.");
		    rt = 0;
		    break;
		case SWAMP:
		    pline("It %s rather %s down here.",
			  Blind ? "feels" : "looks",
			  Blind ? "humid" : "muddy");
		    break;
		case COURT:
		    pline("You enter an opulent throne room!");
		    break;
		case LEPREHALL:
		    pline("You enter a leprechaun hall!");
		    break;
		case MORGUE:
		    if (midnight()) {
			const char *run = locomotion(youmonst.data, "Run");
			pline("%s away!  %s away!", run, run);
		    } else
			pline("You have an uncanny feeling...");
		    break;
		case BEEHIVE:
		    pline("You enter a giant beehive!");
		    rt = 0;
		    break;
		case LEMUREPIT:
		    pline("You enter a put of screaming lemures!");
		    break;
		case COCKNEST:
		    pline("You enter a disgusting nest!");
		    break;
		case ARMORY:
		    pline("You enter a dilapidated armory.");
		    break;
		case ANTHOLE:
		    pline("You enter an anthole!");
		    break;
		case BARRACKS:
		    if (monstinroom(&mons[PM_SOLDIER], roomno) ||
			monstinroom(&mons[PM_SERGEANT], roomno) ||
			monstinroom(&mons[PM_LIEUTENANT], roomno) ||
			monstinroom(&mons[PM_CAPTAIN], roomno))
			pline("You enter a military barracks!");
		    else
			pline("You enter an abandoned barracks.");
		    break;
		case DELPHI:
		    if (monstinroom(&mons[PM_ORACLE], roomno))
			verbalize("%s, %s, welcome to Delphi!",
					Hello(NULL), plname);
		    check_tutorial_message(QT_T_ORACLE);
		    break;
		case TEMPLE:
		    intemple(roomno + ROOMOFFSET);
		    /* fall through */
		default:
		    rt = 0;
	    }

	    if (rt != 0) {
		level->rooms[roomno].rtype = OROOM;
		if (!search_special(level, rt)) {
			/* No more room of that type */
			switch(rt) {
			    case COURT:
				level->flags.has_court = 0;
				break;
			    case GARDEN:
				level->flags.has_garden = 0;
				break;
			    case SWAMP:
				level->flags.has_swamp = 0;
				break;
			    case MORGUE:
				level->flags.has_morgue = 0;
				break;
			    case ZOO:
				level->flags.has_zoo = 0;
				break;
			    case BARRACKS:
				level->flags.has_barracks = 0;
				break;
			    case TEMPLE:
				level->flags.has_temple = 0;
				break;
			    case BEEHIVE:
				level->flags.has_beehive = 0;
				break;
			    case LEMUREPIT:
				level->flags.has_lemurepit = 0;
				break;
			}
		}
		if (rt == COURT || rt == SWAMP || rt == MORGUE ||
			rt == ZOO || rt == GARDEN) {
		    for (mtmp = level->monlist; mtmp; mtmp = mtmp->nmon) {
			if (!DEADMONSTER(mtmp) && isok(mtmp->mx, mtmp->my) &&
				/* wake monsters in the room, not the whole level */
				strchr(in_rooms(level, mtmp->mx, mtmp->my, 0),
				       roomno + ROOMOFFSET) &&
				!Stealth && !rn2(3))
			    mtmp->msleeping = 0;
		    }
		}
	    }
	}

	return;
}